

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::TextureFilterMinmaxFilteringTestCaseBase::iterate
          (TextureFilterMinmaxFilteringTestCaseBase *this)

{
  uint uVar1;
  SupportedTextureType *this_00;
  int iVar2;
  deUint32 err;
  GLuint GVar3;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  pointer pRVar6;
  pointer pSVar7;
  TestError *this_01;
  pointer ppSVar8;
  pointer ppSVar9;
  SupportedTextureType *this_02;
  pointer __k;
  pointer pSVar10;
  GLuint resultTextureId;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  reductionModeTexelSumMap;
  GLuint local_a0 [2];
  RenderContext *local_98;
  float local_8c;
  IVec2 local_88;
  IVec2 local_80;
  pointer local_78;
  undefined8 local_6c;
  undefined4 local_64;
  _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  local_60;
  long lVar4;
  
  local_98 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*local_98->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  ppSVar9 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar8 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar9 != ppSVar8) {
    pSVar7 = (this->m_utils).m_supportedTextureDataTypes.
             super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pSVar10 = (this->m_utils).m_supportedTextureDataTypes.
                super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pSVar10 != pSVar7) {
        this_00 = *ppSVar9;
        local_78 = ppSVar9;
        do {
          uVar1 = pSVar10->m_testFlags;
          if ((((uVar1 & 1) != 0) && (((uVar1 & 4) == 0 || (this_00->m_type != 0x806f)))) &&
             (((uVar1 & 8) == 0 || (this_00->m_type != 0x8513)))) {
            local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_60._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_60._M_impl.super__Rb_tree_header._M_header;
            local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
            pRVar6 = (this->m_utils).m_reductionModeParams.
                     super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_60._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            for (__k = (this->m_utils).m_reductionModeParams.
                       super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                       ._M_impl.super__Vector_impl_data._M_start; __k != pRVar6; __k = __k + 1) {
              if (__k->m_queryTestOnly == false) {
                local_8c = this->m_renderScale * 32.0;
                local_6c = 0x2000000020;
                local_64 = 0x20;
                (*this_00->_vptr_SupportedTextureType[4])
                          (this_00,local_98,&local_6c,(ulong)pSVar10->m_format,
                           (ulong)pSVar10->m_type,(ulong)this->m_mipmapping);
                local_a0[0] = 0;
                (**(code **)(lVar4 + 0x6f8))(1,local_a0);
                err = (**(code **)(lVar4 + 0x800))();
                glu::checkError(err,"glGenTextures() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                                ,0x2b0);
                iVar2 = (int)local_8c;
                this_02 = this_00;
                local_80.m_data[0] = iVar2;
                local_80.m_data[1] = iVar2;
                TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO
                          (this_00,local_98,local_a0[0],&local_80,__k->m_reductionMode);
                local_88.m_data[0] = iVar2;
                local_88.m_data[1] = iVar2;
                GVar3 = TextureFilterMinmaxUtils::calcPixelSumValue
                                  ((TextureFilterMinmaxUtils *)this_02,local_98,local_a0[0],
                                   &local_88,0x1903,0x1401);
                pmVar5 = std::
                         map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                         ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                       *)&local_60,&__k->m_reductionMode);
                *pmVar5 = GVar3;
                (**(code **)(lVar4 + 0x480))(1,local_a0);
                pRVar6 = (this->m_utils).m_reductionModeParams.
                         super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            local_a0[0] = 0x8007;
            pmVar5 = std::
                     map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                     ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                   *)&local_60,(key_type_conflict *)local_a0);
            uVar1 = *pmVar5;
            local_a0[1] = 0x9367;
            pmVar5 = std::
                     map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                     ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                   *)&local_60,(key_type_conflict *)(local_a0 + 1));
            if (*pmVar5 <= uVar1) {
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,
                         "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB"
                         ,
                         "reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                         ,699);
LAB_00a27941:
              __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            local_a0[0] = 0x8008;
            pmVar5 = std::
                     map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                     ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                   *)&local_60,(key_type_conflict *)local_a0);
            uVar1 = *pmVar5;
            local_a0[1] = 0x9367;
            pmVar5 = std::
                     map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                     ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                   *)&local_60,(key_type_conflict *)(local_a0 + 1));
            if (uVar1 <= *pmVar5) {
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,
                         "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB"
                         ,
                         "reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                         ,0x2be);
              goto LAB_00a27941;
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
            ::~_Rb_tree(&local_60);
            pSVar7 = (this->m_utils).m_supportedTextureDataTypes.
                     super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar10 = pSVar10 + 1;
        } while (pSVar10 != pSVar7);
        ppSVar8 = (this->m_utils).m_supportedTextureTypes.
                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppSVar9 = local_78;
      }
      ppSVar9 = ppSVar9 + 1;
    } while (ppSVar9 != ppSVar8);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxFilteringTestCaseBase::iterate()
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	const glw::Functions&	 gl			= renderContext.getFunctions();

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter textureTypeIter =
			 m_utils.getSupportedTextureTypes().begin();
		 textureTypeIter != m_utils.getSupportedTextureTypes().end(); ++textureTypeIter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *textureTypeIter;

		for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter dataTypeIter =
				 m_utils.getSupportedTextureDataTypes().begin();
			 dataTypeIter != m_utils.getSupportedTextureDataTypes().end(); ++dataTypeIter)
		{
			if (!dataTypeIter->hasFlag(TextureFilterMinmaxUtils::MINMAX))
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_3D) && textureType->getType() == GL_TEXTURE_3D)
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_CUBE) &&
				textureType->getType() == GL_TEXTURE_CUBE_MAP)
				continue;

			std::map<glw::GLint, glw::GLuint> reductionModeTexelSumMap;

			for (TextureFilterMinmaxUtils::ReductionModeParamIter paramIter = m_utils.getReductionModeParams().begin();
				 paramIter != m_utils.getReductionModeParams().end(); ++paramIter)
			{
				if (paramIter->m_queryTestOnly)
					continue;

				tcu::IVec2 scaledTextureSize(int(float(TEXTURE_FILTER_MINMAX_SIZE) * m_renderScale));

				textureType->generate(renderContext, tcu::IVec3(TEXTURE_FILTER_MINMAX_SIZE), dataTypeIter->m_format,
									  dataTypeIter->m_type, m_mipmapping);

				glw::GLuint resultTextureId = 0;
				gl.genTextures(1, &resultTextureId);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

				textureType->renderToFBO(renderContext, resultTextureId, scaledTextureSize, paramIter->m_reductionMode);

				reductionModeTexelSumMap[paramIter->m_reductionMode] = m_utils.calcPixelSumValue(
					renderContext, resultTextureId, scaledTextureSize, GL_RED, GL_UNSIGNED_BYTE);

				gl.deleteTextures(1, &resultTextureId);
			}

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB");

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}